

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_display.cpp
# Opt level: O2

size_t __thiscall cppurses::Text_display::index_at(Text_display *this,Point position)

{
  const_reference pvVar1;
  size_t sVar2;
  ulong uVar3;
  size_type __n;
  long lVar4;
  
  uVar3 = position.x;
  __n = this->top_line_ + position.y;
  if (__n < (ulong)((long)(this->display_state_).
                          super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(this->display_state_).
                          super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 4)) {
    pvVar1 = std::
             vector<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
             ::at(&this->display_state_,__n);
    if (pvVar1->length <= uVar3) {
      if (pvVar1->length != 0) {
        lVar4 = position.y + this->top_line_;
        if (lVar4 != ((long)(this->display_state_).
                            super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->display_state_).
                            super__Vector_base<cppurses::Text_display::Line_info,_std::allocator<cppurses::Text_display::Line_info>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 4) + -1) {
          sVar2 = first_index_at(this,lVar4 + 1);
          return sVar2 - 1;
        }
        goto LAB_0015bbc7;
      }
      uVar3 = 0;
    }
    sVar2 = uVar3 + pvVar1->start_index;
  }
  else {
LAB_0015bbc7:
    sVar2 = ((long)(this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>
                   .super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                   super__Vector_impl_data._M_finish -
            (long)(this->contents_).super_vector<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>.
                  super__Vector_base<cppurses::Glyph,_std::allocator<cppurses::Glyph>_>._M_impl.
                  super__Vector_impl_data._M_start) / 0x18;
  }
  return sVar2;
}

Assistant:

std::size_t Text_display::index_at(Point position) const {
    auto line = this->top_line() + position.y;
    if (line >= display_state_.size()) {
        return this->contents().size();
    }
    auto info = display_state_.at(line);
    if (position.x >= info.length) {
        if (info.length == 0) {
            position.x = 0;
        } else if (this->top_line() + position.y != this->last_line()) {
            return this->first_index_at(this->top_line() + position.y + 1) - 1;
        } else if (this->top_line() + position.y == this->last_line()) {
            return this->contents().size();
        } else {
            position.x = info.length - 1;
        }
    }
    return info.start_index + position.x;
}